

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Utf8CheckMode google::protobuf::internal::cpp::GetUtf8CheckMode(FieldDescriptor *field,bool is_lite)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  
  if (field->type_ != '\t') {
    if (field->type_ != '\v') {
      return kNone;
    }
    pDVar1 = FieldDescriptor::message_type(field);
    if ((pDVar1->options_->field_0)._impl_.map_entry_ != true) {
      return kNone;
    }
    pDVar1 = FieldDescriptor::message_type(field);
    pFVar2 = Descriptor::map_key(pDVar1);
    if (pFVar2->type_ != '\t') {
      pDVar1 = FieldDescriptor::message_type(field);
      pFVar2 = Descriptor::map_value(pDVar1);
      if (pFVar2->type_ != '\t') {
        return kNone;
      }
    }
  }
  bVar3 = (field->merged_features_->field_0)._impl_.utf8_validation_ != 2;
  if (is_lite && bVar3) {
    return kNone;
  }
  return bVar3;
}

Assistant:

Utf8CheckMode GetUtf8CheckMode(const FieldDescriptor* field, bool is_lite) {
  if (field->type() == FieldDescriptor::TYPE_STRING ||
      (field->is_map() && (field->message_type()->map_key()->type() ==
                               FieldDescriptor::TYPE_STRING ||
                           field->message_type()->map_value()->type() ==
                               FieldDescriptor::TYPE_STRING))) {
    if (IsStrictUtf8(field)) {
      return Utf8CheckMode::kStrict;
    } else if (IsVerifyUtf8(field, is_lite)) {
      return Utf8CheckMode::kVerify;
    }
  }
  return Utf8CheckMode::kNone;
}